

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

Result * __thiscall Catch::Clara::Parser::validate(Parser *this)

{
  bool bVar1;
  reference pAVar2;
  long in_RSI;
  Result *in_RDI;
  Arg *arg;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_> *__range2_1;
  Opt *opt;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_> *__range2;
  Result *result;
  vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_> *in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  __normal_iterator<const_Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
  local_58;
  long local_50;
  uint local_48;
  byte local_31;
  reference local_30;
  Opt *local_28;
  __normal_iterator<const_Catch::Clara::Opt_*,_std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>_>
  local_20;
  long local_18;
  
  local_18 = in_RSI + 0x30;
  local_20._M_current =
       (Opt *)std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::begin
                        ((vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_> *)
                         in_stack_ffffffffffffff68);
  local_28 = (Opt *)std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::end
                              ((vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_> *)
                               in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::Clara::Opt_*,_std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff77,
                                   CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
                       (__normal_iterator<const_Catch::Clara::Opt_*,_std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) {
      local_50 = in_RSI + 0x48;
      local_58._M_current =
           (Arg *)std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::begin
                            (in_stack_ffffffffffffff68);
      std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::end
                (in_stack_ffffffffffffff68);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)
                                      ),
                           (__normal_iterator<const_Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
                            *)in_stack_ffffffffffffff68);
        if (!bVar1) {
          Detail::BasicResult<void>::ok();
          return in_RDI;
        }
        pAVar2 = __gnu_cxx::
                 __normal_iterator<const_Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
                 ::operator*(&local_58);
        (*(pAVar2->super_ParserRefImpl<Catch::Clara::Arg>).
          super_ComposableParserImpl<Catch::Clara::Arg>.super_ParserBase._vptr_ParserBase[2])
                  (in_RDI);
        in_stack_ffffffffffffff76 =
             Detail::BasicResult::operator_cast_to_bool((BasicResult *)in_RDI);
        local_48 = (uint)!(bool)in_stack_ffffffffffffff76;
        if ((bool)in_stack_ffffffffffffff76) {
          Detail::BasicResult<void>::~BasicResult
                    ((BasicResult<void> *)
                     CONCAT17(in_stack_ffffffffffffff77,
                              CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)));
        }
        if (local_48 != 0) break;
        __gnu_cxx::
        __normal_iterator<const_Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
        ::operator++(&local_58);
      }
      return in_RDI;
    }
    local_30 = __gnu_cxx::
               __normal_iterator<const_Catch::Clara::Opt_*,_std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>_>
               ::operator*(&local_20);
    local_31 = 0;
    (*(local_30->super_ParserRefImpl<Catch::Clara::Opt>).
      super_ComposableParserImpl<Catch::Clara::Opt>.super_ParserBase._vptr_ParserBase[2])(in_RDI);
    in_stack_ffffffffffffff77 = Detail::BasicResult::operator_cast_to_bool((BasicResult *)in_RDI);
    if (!(bool)in_stack_ffffffffffffff77) {
      local_31 = 1;
    }
    local_48 = (uint)!(bool)in_stack_ffffffffffffff77;
    if ((local_31 & 1) == 0) {
      Detail::BasicResult<void>::~BasicResult
                ((BasicResult<void> *)
                 CONCAT17(in_stack_ffffffffffffff77,
                          CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)));
    }
    if (local_48 != 0) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::Clara::Opt_*,_std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>_>
    ::operator++(&local_20);
  }
  return in_RDI;
}

Assistant:

Detail::Result Parser::validate() const {
            for ( auto const& opt : m_options ) {
                auto result = opt.validate();
                if ( !result )
                    return result;
            }
            for ( auto const& arg : m_args ) {
                auto result = arg.validate();
                if ( !result )
                    return result;
            }
            return Detail::Result::ok();
        }